

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezone.cpp
# Opt level: O0

bool QTimeZone::isTimeZoneIdAvailable(QByteArray *ianaId)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  qint64 qVar4;
  QTimeZonePrivate *pQVar5;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  QUtcTimeZonePrivate *in_stack_ffffffffffffff20;
  undefined6 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2e;
  undefined1 in_stack_ffffffffffffff2f;
  QByteArrayView *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  byte bVar6;
  QUtcTimeZonePrivate *this;
  QByteArrayView in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = (QUtcTimeZonePrivate *)&stack0xffffffffffffff80;
  QUtcTimeZonePrivate::QUtcTimeZonePrivate(this);
  bVar2 = QUtcTimeZonePrivate::isTimeZoneIdAvailable
                    (this,(QByteArray *)
                          CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  bVar6 = 1;
  if (!bVar2) {
    QByteArrayView::QByteArrayView<QByteArray,_true>
              (in_stack_ffffffffffffff30,
               (QByteArray *)
               CONCAT17(in_stack_ffffffffffffff2f,
                        CONCAT16(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28)));
    qVar4 = QUtcTimeZonePrivate::offsetFromUtcString(in_stack_ffffffffffffffd0);
    iVar3 = QTimeZonePrivate::invalidSeconds();
    bVar6 = 1;
    if (qVar4 == iVar3) {
      QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_global_tz>_>::operator->
                ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_global_tz>_> *)
                 0x581c7d);
      pQVar5 = QExplicitlySharedDataPointer<QTimeZonePrivate>::operator->
                         ((QExplicitlySharedDataPointer<QTimeZonePrivate> *)0x581c8e);
      iVar3 = (*pQVar5->_vptr_QTimeZonePrivate[0x14])(pQVar5,in_RDI);
      bVar6 = (byte)iVar3;
    }
  }
  QUtcTimeZonePrivate::~QUtcTimeZonePrivate(in_stack_ffffffffffffff20);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar6 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QTimeZone::isTimeZoneIdAvailable(const QByteArray &ianaId)
{
#if defined(Q_OS_UNIX) && !(defined(Q_OS_ANDROID) || defined(Q_OS_DARWIN))
    // Keep #if-ery consistent with selection of QTzTimeZonePrivate in
    // newBackendTimeZone(). Skip the pre-check, as the TZ backend accepts POSIX
    // zone IDs, which need not be valid IANA IDs. See also QTBUG-112006.
#else
    // isValidId is not strictly required, but faster to weed out invalid
    // IDs as availableTimeZoneIds() may be slow
    if (!QTimeZonePrivate::isValidId(ianaId))
        return false;
#endif
    return QUtcTimeZonePrivate().isTimeZoneIdAvailable(ianaId)
        || QUtcTimeZonePrivate::offsetFromUtcString(ianaId) != QTimeZonePrivate::invalidSeconds()
        || global_tz->backend->isTimeZoneIdAvailable(ianaId);
}